

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

void __thiscall
Lib::
SkipList<Inferences::ALASCA::BinaryResolutionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LDComparator>
::~SkipList(SkipList<Inferences::ALASCA::BinaryResolutionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LDComparator>
            *this)

{
  Node *in_RDI;
  SkipList<Inferences::ALASCA::BinaryResolutionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LDComparator>
  *in_stack_00000020;
  uint in_stack_ffffffffffffffec;
  
  makeEmpty(in_stack_00000020);
  deallocate(in_RDI,in_stack_ffffffffffffffec);
  return;
}

Assistant:

~SkipList()
  {
    makeEmpty();
    deallocate(_left,SKIP_LIST_MAX_HEIGHT);
  }